

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni_log.c
# Opt level: O3

int LogWrite(LogLevel level,char *tags,char *function,int line,char *fmt,...)

{
  char in_AL;
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  undefined8 in_R9;
  size_t __maxlen;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char now [64];
  undefined8 local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char local_128 [64];
  undefined1 local_e8 [40];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_c0 = in_R9;
  if (g_inited == '\0') {
    uni_mutex_new(&g_mutex);
    g_inited = '\x01';
  }
  local_138 = local_e8;
  local_140 = &stack0x00000008;
  local_148 = 0x3000000028;
  uni_mutex_lock(&g_mutex);
  iVar2 = 0;
  if (level == N_LOG_RAW) goto LAB_0010150f;
  iVar2 = 0;
  uVar3 = 0;
  switch(level) {
  case N_LOG_ERROR:
    pcVar5 = "[E]";
    pcVar8 = "\x1b[0m\x1b[41;33m[E]\x1b[0m";
    break;
  case N_LOG_WARN:
    pcVar5 = "[W]";
    pcVar8 = "\x1b[0m\x1b[41;33m[W]\x1b[0m";
    break;
  case N_LOG_TRACK:
    pcVar5 = "[T]";
    pcVar8 = "\x1b[0m\x1b[42;33m[T]\x1b[0m";
    break;
  case N_LOG_DEBUG:
    pcVar5 = "[D]";
    pcVar8 = "\x1b[0m\x1b[47;33m[D]\x1b[0m";
    break;
  default:
    goto switchD_0010129d_default;
  }
  if (g_log_config_3 == 0) {
    pcVar8 = pcVar5;
  }
  uVar3 = snprintf(_sync_write_process_buf,0x800,"%s ",pcVar8);
switchD_0010129d_default:
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  if (g_log_config_0 != 0) {
    uVar6 = uni_get_clock_time_ms();
    iVar2 = 0;
    snprintf(local_128,0x40,"%ld ",uVar6);
    iVar1 = snprintf(_sync_write_process_buf + uVar3,(long)(int)(0x800 - uVar3),"%s",local_128);
    if (-1 < iVar1) {
      iVar2 = snprintf(_sync_write_process_buf + uVar3,(long)(int)(0x800 - uVar3),"%s",local_128);
    }
  }
  iVar2 = iVar2 + uVar3;
  iVar1 = 0;
  if (g_log_config_1 != 0) {
    uVar3 = uni_thread_self();
    iVar1 = 0;
    snprintf(local_128,0x20,"%x",(ulong)uVar3);
    iVar4 = snprintf(_sync_write_process_buf + iVar2,(long)(0x800 - iVar2),"%s",local_128);
    if (-1 < iVar4) {
      iVar1 = snprintf(_sync_write_process_buf + iVar2,(long)(0x800 - iVar2),"%s",local_128);
    }
  }
  iVar1 = iVar1 + iVar2;
  iVar2 = snprintf(_sync_write_process_buf + iVar1,(long)(0x800 - iVar1),"<%s>",tags);
  iVar4 = 0;
  if (-1 < iVar2) {
    iVar4 = snprintf(_sync_write_process_buf + iVar1,(long)(0x800 - iVar1),"<%s>",tags);
  }
  iVar4 = iVar4 + iVar1;
  if (g_log_config_2 == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    iVar1 = snprintf(_sync_write_process_buf + iVar4,(long)(0x800 - iVar4),"%s:%d->",function,
                     (ulong)(uint)line);
    if (-1 < iVar1) {
      iVar2 = snprintf(_sync_write_process_buf + iVar4,(long)(0x800 - iVar4),"%s:%d->",function,
                       (ulong)(uint)line);
    }
  }
  iVar2 = iVar2 + iVar4;
LAB_0010150f:
  lVar7 = (long)iVar2;
  __maxlen = 0x800 - lVar7;
  iVar1 = vsnprintf(_sync_write_process_buf + lVar7,__maxlen,fmt,&local_148);
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  if (iVar2 < (int)__maxlen) {
    iVar2 = (int)__maxlen - iVar2;
    if (iVar2 == 1) {
      if (level != N_LOG_RAW) {
        *(undefined1 *)(lVar7 + 0x1040ae + __maxlen) = 10;
      }
    }
    else if (level != N_LOG_RAW) {
      strncat(_sync_write_process_buf + lVar7,"\n",(long)iVar2);
    }
  }
  else {
    if (level != N_LOG_RAW) {
      *(undefined1 *)(lVar7 + 0x1040ae + __maxlen) = 10;
    }
    *(undefined1 *)(lVar7 + 0x1040af + __maxlen) = 0;
  }
  printf("%s",_sync_write_process_buf);
  uni_mutex_unlock(&g_mutex);
  return 0;
}

Assistant:

int LogWrite(LogLevel level, const char *tags, const char *function, int line,
             char *fmt, ...) {
  va_list args;
  _lazy_init();
  va_start(args, fmt);
  _sync_write_process(level, tags, function, line, fmt, args);
  va_end(args);
  return 0;
}